

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gecko.cpp
# Opt level: O3

void __thiscall
MyProgress::beginiter(MyProgress *this,Graph *param_1,uint iter,uint maxiter,uint window)

{
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"i = ",4);
  lVar2 = 1;
  if (9 < maxiter) {
    do {
      lVar2 = lVar2 + 1;
      bVar1 = 99 < maxiter;
      maxiter = maxiter / 10;
    } while (bVar1);
  }
  *(long *)(std::ios_base::Init::~Init + *(long *)(std::cerr + -0x18)) = lVar2;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/",1);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  n = ",6);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
  return;
}

Assistant:

void beginiter(const Graph*, unsigned int iter, unsigned int maxiter, unsigned int window) const
  {
    std::cerr << "i = " << std::setw(width(maxiter)) << iter << "/" << maxiter << "  n = " << window << "  ";
  }